

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Write<unsigned_short>(KDataStream *this,unsigned_short T)

{
  uchar uVar1;
  uchar uVar2;
  uchar local_19;
  
  uVar1 = (uchar)(T >> 8);
  local_19 = (uchar)T;
  uVar2 = uVar1;
  if (this->m_MachineEndian != this->m_NetEndian) {
    uVar2 = local_19;
    local_19 = uVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_vBuffer,&local_19);
  local_19 = uVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_vBuffer,&local_19);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}